

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O2

void fl_normal_measure(Fl_Label *o,int *W,int *H)

{
  Fl_Image *pFVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)o->font,(ulong)(uint)o->size);
  fl_measure(o->value,W,H,1);
  pFVar1 = o->image;
  if (pFVar1 != (Fl_Image *)0x0) {
    if (*W < pFVar1->w_) {
      *W = pFVar1->w_;
    }
    *H = *H + pFVar1->h_;
  }
  return;
}

Assistant:

void
fl_normal_measure(const Fl_Label* o, int& W, int& H) {
  fl_font(o->font, o->size);
  fl_measure(o->value, W, H);
  if (o->image) {
    if (o->image->w() > W) W = o->image->w();
    H += o->image->h();
  }
}